

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

char * __thiscall
cmCTestTestHandler::GetTestStatus(cmCTestTestHandler *this,cmCTestTestResult *result)

{
  ulong uVar1;
  string *psVar2;
  
  uVar1 = (ulong)(uint)result->Status;
  if (9 < uVar1) {
    return "No Status";
  }
  psVar2 = (string *)(GetTestStatus::statuses + uVar1);
  if (uVar1 == 6) {
    psVar2 = &result->ExceptionStatus;
  }
  return (psVar2->_M_dataplus)._M_p;
}

Assistant:

const char* cmCTestTestHandler::GetTestStatus(const cmCTestTestResult* result)
{
  static const char* statuses[] = { "Not Run",     "Timeout",   "SEGFAULT",
                                    "ILLEGAL",     "INTERRUPT", "NUMERICAL",
                                    "OTHER_FAULT", "Failed",    "BAD_COMMAND",
                                    "Completed" };
  int status = result->Status;
  if (status < cmCTestTestHandler::NOT_RUN ||
      status > cmCTestTestHandler::COMPLETED) {
    return "No Status";
  }
  if (status == cmCTestTestHandler::OTHER_FAULT) {
    return result->ExceptionStatus.c_str();
  }
  return statuses[status];
}